

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int fileIn_version_3(FILE *fp)

{
  object *poVar1;
  object *startupClass;
  object *specialSymbols;
  FILE *fp_local;
  
  if (inSpaceOne == 0) {
    indirArray = (object **)spaceOne;
  }
  else {
    indirArray = (object **)spaceTwo;
  }
  indirtop = 0;
  info_impl("fileIn_version_3",0x156,"reading globals object.");
  globalsObject = objectRead(fp);
  addStaticRoot(&globalsObject);
  if (debugging != 0) {
    printf("Globals: ");
    dumpDictKeys(globalsObject);
    printf("\n");
  }
  info_impl("fileIn_version_3",0x161,"Finding special symbols.");
  poVar1 = lookupGlobal("specialSymbols");
  binaryMessages[0] = (object *)poVar1[1].header;
  addStaticRoot(binaryMessages);
  binaryMessages[1] = poVar1[1].class;
  addStaticRoot(binaryMessages + 1);
  binaryMessages[2] = (object *)poVar1[2].header;
  addStaticRoot(binaryMessages + 2);
  badMethodSym = poVar1[2].class;
  addStaticRoot(&badMethodSym);
  nilObject = lookupGlobal("nil");
  addStaticRoot(&nilObject);
  trueObject = lookupGlobal("true");
  addStaticRoot(&trueObject);
  falseObject = lookupGlobal("false");
  addStaticRoot(&falseObject);
  ArrayClass = lookupGlobal("Array");
  addStaticRoot(&ArrayClass);
  BlockClass = lookupGlobal("Block");
  addStaticRoot(&BlockClass);
  ByteArrayClass = lookupGlobal("ByteArray");
  addStaticRoot(&ByteArrayClass);
  ContextClass = lookupGlobal("Context");
  addStaticRoot(&ContextClass);
  DictionaryClass = lookupGlobal("Dictionary");
  addStaticRoot(&DictionaryClass);
  IntegerClass = lookupGlobal("Integer");
  addStaticRoot(&IntegerClass);
  SmallIntClass = lookupGlobal("SmallInt");
  addStaticRoot(&SmallIntClass);
  StringClass = lookupGlobal("String");
  addStaticRoot(&StringClass);
  SymbolClass = lookupGlobal("Symbol");
  addStaticRoot(&SymbolClass);
  UndefinedClass = lookupGlobal("Undefined");
  addStaticRoot(&UndefinedClass);
  info_impl("fileIn_version_3",0x198,"Memory top %p",memoryTop);
  info_impl("fileIn_version_3",0x199,"Memory pointer %p",memoryPointer);
  info_impl("fileIn_version_3",0x19b,"Read in %d objects.",(ulong)(uint)indirtop);
  return indirtop;
}

Assistant:

int fileIn_version_3(FILE *fp)
{
    struct object *specialSymbols = NULL;
    struct object *startupClass = NULL;

    /* use the currently unused space for the indir pointers */
    if (inSpaceOne) {
        indirArray = (struct object * *) spaceTwo;
    } else {
        indirArray = (struct object * *) spaceOne;
    }
    indirtop = 0;

    /* read the base objects from the image file. */

    info("reading globals object.");
    globalsObject = objectRead(fp);
    addStaticRoot(&globalsObject);

    if(debugging) {
        printf("Globals: ");
        dumpDictKeys(globalsObject);
        printf("\n");
    }

    /* fix up everything from globals. */
    info("Finding special symbols.");
    specialSymbols = lookupGlobal("specialSymbols");

    binaryMessages[0] = specialSymbols->data[0];
    addStaticRoot(&binaryMessages[0]);

    binaryMessages[1] = specialSymbols->data[1];
    addStaticRoot(&binaryMessages[1]);

    binaryMessages[2] = specialSymbols->data[2];
    addStaticRoot(&binaryMessages[2]);

    badMethodSym = specialSymbols->data[3];
    addStaticRoot(&badMethodSym);

    /* look up the rest in the globals object. */
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);

    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);

    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);

    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);

    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);

    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);

    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);

    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);

    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);

    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);

    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);

    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);

    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);

    info("Memory top %p", memoryTop);
    info("Memory pointer %p", memoryPointer);

    info("Read in %d objects.", indirtop);

    return indirtop;
}